

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

void __thiscall OpenMD::ZConstraintForceModifier::modifyForces(ZConstraintForceModifier *this)

{
  bool bVar1;
  SnapshotManager *this_00;
  Snapshot *pSVar2;
  double *pdVar3;
  pointer pZVar4;
  Molecule *in_RDI;
  RealType RVar5;
  Vector3d com;
  iterator i;
  ZConstraintForceModifier *in_stack_000000e0;
  ZConstraintForceModifier *in_stack_00000100;
  ZConstraintForceModifier *in_stack_00000110;
  ZConstraintForceModifier *in_stack_000001f0;
  Vector3<double> *in_stack_ffffffffffffff98;
  ZConstraintForceModifier *in_stack_ffffffffffffffa0;
  ZConstraintForceModifier *in_stack_ffffffffffffffb0;
  ZConstraintForceModifier *in_stack_ffffffffffffffc0;
  _Self local_38;
  _List_node_base *local_30;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *in_stack_ffffffffffffffe8;
  iterator this_01;
  Molecule *this_02;
  
  this_02 = in_RDI;
  this_00 = SimInfo::getSnapshotManager(*(SimInfo **)&in_RDI->globalIndex_);
  pSVar2 = SnapshotManager::getCurrentSnapshot(this_00);
  (in_RDI->constraintPairs_).
  super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pSVar2;
  if (((ulong)(in_RDI->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start & 1) != 0) {
    updateZPos(in_stack_ffffffffffffffc0);
  }
  bVar1 = checkZConsState(in_stack_000001f0);
  if (bVar1) {
    calcTotalMassMovingZMols(in_stack_ffffffffffffffb0);
    zeroVelocity(in_stack_00000110);
  }
  bVar1 = haveFixedZMols(in_stack_ffffffffffffffa0);
  if (bVar1) {
    doZconstraintForce(in_stack_00000100);
  }
  bVar1 = haveMovingZMols(in_stack_ffffffffffffffa0);
  if (bVar1) {
    doHarmonic(in_stack_000000e0);
  }
  RVar5 = Snapshot::getTime((Snapshot *)
                            (in_RDI->constraintPairs_).
                            super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((double)(in_RDI->constraintElems_).
              super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
              ._M_impl.super__Vector_impl_data._M_start <= RVar5) {
    std::_List_iterator<OpenMD::ZconstraintMol>::_List_iterator
              ((_List_iterator<OpenMD::ZconstraintMol> *)&stack0xfffffffffffffff0);
    Vector3<double>::Vector3((Vector3<double> *)0x188f96);
    local_30 = (_List_node_base *)
               std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
               begin((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                     in_stack_ffffffffffffff98);
    this_01 = (iterator)local_30;
    while( true ) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                     ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                      in_stack_ffffffffffffff98);
      bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffff0,&local_38);
      if (!bVar1) break;
      std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                ((_List_iterator<OpenMD::ZconstraintMol> *)0x188fe5);
      Molecule::getCom(this_02);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      pdVar3 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)&stack0xffffffffffffffd8,2);
      in_stack_ffffffffffffffa0 = (ZConstraintForceModifier *)*pdVar3;
      pZVar4 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                         ((_List_iterator<OpenMD::ZconstraintMol> *)0x189024);
      pZVar4->zpos = (RealType)in_stack_ffffffffffffffa0;
      std::_List_iterator<OpenMD::ZconstraintMol>::operator++
                ((_List_iterator<OpenMD::ZconstraintMol> *)&stack0xfffffffffffffff0);
    }
    ZConsWriter::writeFZ((ZConsWriter *)this_01._M_node,in_stack_ffffffffffffffe8);
    (in_RDI->constraintElems_).
    super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((double)(in_RDI->torsions_).
                           super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                  (double)(in_RDI->constraintElems_).
                          super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ZConstraintForceModifier::modifyForces() {
    currSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

    if (usingZconsGap_) { updateZPos(); }

    if (checkZConsState()) {
      calcTotalMassMovingZMols();
      zeroVelocity();
    }

    // do zconstraint force;
    if (haveFixedZMols()) { doZconstraintForce(); }

    // use external force to move the molecules to the specified positions
    if (haveMovingZMols()) { doHarmonic(); }

    // write out forces and current positions of z-constraint molecules
    if (currSnapshot_->getTime() >= currZconsTime_) {
      std::list<ZconstraintMol>::iterator i;
      Vector3d com;
      for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
        com     = i->mol->getCom();
        i->zpos = com[whichDirection];
      }

      fzOut->writeFZ(fixedZMols_);
      currZconsTime_ += zconsTime_;
    }
  }